

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductBase.h
# Opt level: O3

void __thiscall
Eigen::
ProductBase<Eigen::GeneralProduct<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>_>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>_>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
::ProductBase(ProductBase<Eigen::GeneralProduct<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *this,ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>_>
                    *a_lhs,Matrix<double,__1,__1,_0,__1,__1> *a_rhs)

{
  ulong nbRows;
  ulong nbCols;
  undefined1 auVar1 [16];
  undefined8 *puVar2;
  
  (this->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->m_lhs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  nbRows = *(ulong *)(a_lhs + 8);
  nbCols = *(ulong *)(a_lhs + 0x10);
  if ((long)(nbCols | nbRows) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((nbCols != 0 && nbRows != 0) &&
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar1 / SEXT816((long)nbCols),0) < (long)nbRows)) {
    puVar2 = (undefined8 *)
             __cxa_allocate_exception(8,a_lhs,SUB168(auVar1 % SEXT816((long)nbCols),0));
    *puVar2 = operator_delete;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * nbRows,nbRows,nbCols);
  internal::
  compute_inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1>
  ::run((Matrix<double,__1,__1,_0,__1,__1> *)a_lhs,&this->m_lhs);
  this->m_rhs = a_rhs;
  (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  if (*(long *)(a_lhs + 0x10) ==
      (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows) {
    return;
  }
  __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/ProductBase.h"
                ,0x66,
                "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>>>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>>>, Eigen::Matrix<double, -1, -1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>>>, Eigen::Matrix<double, -1, -1>, 5>, Lhs = Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>>>, Rhs = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

const Scalar& alpha() const { return m_alpha; }